

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O3

BlockIterator<helics::Publication,_32,_helics::Publication_**> * __thiscall
gmlc::containers::
DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>::
find(BlockIterator<helics::Publication,_32,_helics::Publication_**> *__return_storage_ptr__,
    DualStringMappedVector<helics::Publication,_helics::InterfaceHandle,_(reference_stability)0,_5>
    *this,string_view searchValue)

{
  long lVar1;
  uint uVar2;
  iterator iVar3;
  Publication **ppPVar4;
  int iVar5;
  Publication *pPVar6;
  key_type local_20;
  
  local_20._M_str = searchValue._M_str;
  local_20._M_len = searchValue._M_len;
  iVar3 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->lookup1)._M_h,&local_20);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    iVar5 = (this->dataStorage).bsize;
    ppPVar4 = (this->dataStorage).dataptr;
    if ((long)iVar5 == 0x20) {
      if (ppPVar4 == (Publication **)0x0) {
        ppPVar4 = (Publication **)
                  &StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>::
                   end()::emptyValue;
      }
      else {
        ppPVar4 = ppPVar4 + (long)(this->dataStorage).dataSlotIndex + 1;
      }
      pPVar6 = *ppPVar4;
      iVar5 = 0;
    }
    else {
      ppPVar4 = ppPVar4 + (this->dataStorage).dataSlotIndex;
      pPVar6 = *ppPVar4 + iVar5;
    }
    __return_storage_ptr__->vec = ppPVar4;
    __return_storage_ptr__->ptr = pPVar6;
    __return_storage_ptr__->offset = iVar5;
    return __return_storage_ptr__;
  }
  if ((this->dataStorage).csize == 0) {
    iVar5 = (this->dataStorage).bsize;
    ppPVar4 = (this->dataStorage).dataptr;
    if ((long)iVar5 != 0x20) {
      ppPVar4 = ppPVar4 + (this->dataStorage).dataSlotIndex;
      pPVar6 = *ppPVar4 + iVar5;
      goto LAB_001f4dd6;
    }
    if (ppPVar4 == (Publication **)0x0) {
      ppPVar4 = (Publication **)
                &StableBlockVector<helics::Publication,5u,std::allocator<helics::Publication>>::
                 end()::emptyValue;
    }
    else {
      ppPVar4 = ppPVar4 + (long)(this->dataStorage).dataSlotIndex + 1;
    }
  }
  else {
    ppPVar4 = (this->dataStorage).dataptr;
  }
  pPVar6 = *ppPVar4;
  iVar5 = 0;
LAB_001f4dd6:
  lVar1 = *(long *)((long)iVar3.
                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                          ._M_cur + 0x18);
  __return_storage_ptr__->vec = ppPVar4;
  __return_storage_ptr__->ptr = pPVar6 + lVar1;
  uVar2 = (int)lVar1 + iVar5;
  __return_storage_ptr__->offset = uVar2;
  if (0x1f < (int)uVar2) {
    __return_storage_ptr__->vec = ppPVar4 + (ulong)(uVar2 - 0x20 >> 5) + 1;
    __return_storage_ptr__->offset = uVar2 & 0x1f;
    __return_storage_ptr__->ptr = ppPVar4[(ulong)(uVar2 - 0x20 >> 5) + 1] + (uVar2 & 0x1f);
  }
  return __return_storage_ptr__;
}

Assistant:

auto find(std::string_view searchValue)
        {
            auto fnd = lookup1.find(searchValue);
            if (fnd != lookup1.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }